

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O1

int greatest_do_assert_equal_t(void *expd,void *got,greatest_type_info *type_info,void *udata)

{
  int iVar1;
  
  iVar1 = 0;
  if ((type_info != (greatest_type_info *)0x0) && (type_info->equal != (greatest_equal_cb *)0x0)) {
    iVar1 = (*type_info->equal)(expd,got,udata);
    if ((iVar1 == 0) && (type_info->print != (greatest_printf_cb *)0x0)) {
      fwrite("\nExpected: ",0xb,1,_stdout);
      (*type_info->print)(expd,udata);
      fwrite("\n     Got: ",0xb,1,_stdout);
      (*type_info->print)(got,udata);
      fputc(10,_stdout);
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}